

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void PushQuad(GUI *gui,mu_Rect dst,mu_Rect src,mu_Color color)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float h;
  float w;
  float y;
  float x;
  int index_idx;
  int element_idx;
  int color_idx;
  int texvert_idx;
  GUI *gui_local;
  int iStack_28;
  mu_Color color_local;
  mu_Rect src_local;
  mu_Rect dst_local;
  
  if (gui->QuadCount == 0x4000) {
    Render(gui);
  }
  iVar1 = gui->QuadCount * 8;
  iVar2 = gui->QuadCount << 4;
  uVar3 = gui->QuadCount * 4;
  iVar4 = gui->QuadCount * 6;
  gui->QuadCount = gui->QuadCount + 1;
  iStack_28 = src.x;
  fVar5 = (float)iStack_28 / 128.0;
  color_local = (mu_Color)src.y;
  fVar6 = (float)(int)color_local / 128.0;
  src_local.x = src.w;
  src_local.y = src.h;
  gui->UVArray[iVar1] = fVar5;
  gui->UVArray[iVar1 + 1] = fVar6;
  gui->UVArray[iVar1 + 2] = fVar5 + (float)src_local.x / 128.0;
  gui->UVArray[iVar1 + 3] = fVar6;
  gui->UVArray[iVar1 + 4] = fVar5;
  gui->UVArray[iVar1 + 5] = fVar6 + (float)src_local.y / 128.0;
  gui->UVArray[iVar1 + 6] = fVar5 + (float)src_local.x / 128.0;
  gui->UVArray[iVar1 + 7] = fVar6 + (float)src_local.y / 128.0;
  src_local.w = dst.x;
  gui->VertexArray[iVar1] = (float)src_local.w;
  src_local.h = dst.y;
  gui->VertexArray[iVar1 + 1] = (float)src_local.h;
  dst_local.x = dst.w;
  gui->VertexArray[iVar1 + 2] = (float)(src_local.w + dst_local.x);
  gui->VertexArray[iVar1 + 3] = (float)src_local.h;
  gui->VertexArray[iVar1 + 4] = (float)src_local.w;
  dst_local.y = dst.h;
  gui->VertexArray[iVar1 + 5] = (float)(src_local.h + dst_local.y);
  gui->VertexArray[iVar1 + 6] = (float)(src_local.w + dst_local.x);
  gui->VertexArray[iVar1 + 7] = (float)(src_local.h + dst_local.y);
  *(mu_Color *)(gui->ColorArray + iVar2) = color;
  *(mu_Color *)(gui->ColorArray + (long)iVar2 + 4) = color;
  *(mu_Color *)(gui->ColorArray + (long)iVar2 + 8) = color;
  *(mu_Color *)(gui->ColorArray + (long)iVar2 + 0xc) = color;
  gui->IndexArray[iVar4] = uVar3;
  gui->IndexArray[iVar4 + 1] = uVar3 + 1;
  gui->IndexArray[iVar4 + 2] = uVar3 + 2;
  gui->IndexArray[iVar4 + 3] = uVar3 + 2;
  gui->IndexArray[iVar4 + 4] = uVar3 + 3;
  gui->IndexArray[iVar4 + 5] = uVar3 + 1;
  return;
}

Assistant:

static void PushQuad(GUI* gui, mu_Rect dst, mu_Rect src, mu_Color color) {
    if (gui->QuadCount == BUFFER_SIZE) {
        Render(gui);
    }

    int texvert_idx = gui->QuadCount * 8;
    int color_idx = gui->QuadCount * 16;
    int element_idx = gui->QuadCount * 4;
    int index_idx = gui->QuadCount * 6;
    gui->QuadCount++;

    float x = src.x / (float) ATLAS_WIDTH;
    float y = src.y / (float) ATLAS_HEIGHT;
    float w = src.w / (float) ATLAS_WIDTH;
    float h = src.h / (float) ATLAS_HEIGHT;
    gui->UVArray[texvert_idx + 0] = x;
    gui->UVArray[texvert_idx + 1] = y;
    gui->UVArray[texvert_idx + 2] = x + w;
    gui->UVArray[texvert_idx + 3] = y;
    gui->UVArray[texvert_idx + 4] = x;
    gui->UVArray[texvert_idx + 5] = y + h;
    gui->UVArray[texvert_idx + 6] = x + w;
    gui->UVArray[texvert_idx + 7] = y + h;

    gui->VertexArray[texvert_idx + 0] = dst.x;
    gui->VertexArray[texvert_idx + 1] = dst.y;
    gui->VertexArray[texvert_idx + 2] = dst.x + dst.w;
    gui->VertexArray[texvert_idx + 3] = dst.y;
    gui->VertexArray[texvert_idx + 4] = dst.x;
    gui->VertexArray[texvert_idx + 5] = dst.y + dst.h;
    gui->VertexArray[texvert_idx + 6] = dst.x + dst.w;
    gui->VertexArray[texvert_idx + 7] = dst.y + dst.h;

    memcpy(gui->ColorArray + color_idx +  0, &color, 4);
    memcpy(gui->ColorArray + color_idx +  4, &color, 4);
    memcpy(gui->ColorArray + color_idx +  8, &color, 4);
    memcpy(gui->ColorArray + color_idx + 12, &color, 4);

    gui->IndexArray[index_idx + 0] = element_idx + 0;
    gui->IndexArray[index_idx + 1] = element_idx + 1;
    gui->IndexArray[index_idx + 2] = element_idx + 2;
    gui->IndexArray[index_idx + 3] = element_idx + 2;
    gui->IndexArray[index_idx + 4] = element_idx + 3;
    gui->IndexArray[index_idx + 5] = element_idx + 1;
}